

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O0

int archive_compressor_gzip_options(archive_write_filter *f,char *key,char *value)

{
  int *piVar1;
  int iVar2;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  private_data_conflict4 *data;
  int local_4;
  
  piVar1 = *(int **)(in_RDI + 0x40);
  iVar2 = strcmp(in_RSI,"compression-level");
  if (iVar2 == 0) {
    if ((((in_RDX == (char *)0x0) || (*in_RDX < '0')) || ('9' < *in_RDX)) || (in_RDX[1] != '\0')) {
      local_4 = -0x14;
    }
    else {
      *piVar1 = *in_RDX + -0x30;
      local_4 = 0;
    }
  }
  else {
    iVar2 = strcmp(in_RSI,"timestamp");
    if (iVar2 == 0) {
      iVar2 = 1;
      if (in_RDX == (char *)0x0) {
        iVar2 = -1;
      }
      piVar1[1] = iVar2;
      local_4 = 0;
    }
    else {
      local_4 = -0x14;
    }
  }
  return local_4;
}

Assistant:

static int
archive_compressor_gzip_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "timestamp") == 0) {
		data->timestamp = (value == NULL)?-1:1;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}